

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O2

void __thiscall
wasm::DataFlow::UseFinder::addSetUses
          (UseFinder *this,LocalSet *set,Graph *graph,LocalGraph *localGraph,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *ret)

{
  _Hash_node_base get;
  ulong uVar1;
  LocalSet *set_00;
  LocalSet *pLVar2;
  int iVar3;
  SetInfluences *pSVar4;
  ostream *poVar5;
  GetInfluences *pGVar6;
  Expression *pEVar7;
  __node_base *p_Var8;
  pair<std::__detail::_Node_iterator<wasm::LocalSet_*,_true,_false>,_bool> pVar9;
  LocalSet *local_40;
  LocalSet *set_local;
  Expression *value;
  
  local_40 = set;
  pVar9 = std::
          _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<wasm::LocalSet*&>
                    ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this,&local_40);
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pSVar4 = LocalGraph::getSetInfluences(localGraph,local_40);
    iVar3 = debug();
    if (1 < iVar3) {
      poVar5 = std::operator<<((ostream *)&std::cout,"addSetUses for ");
      poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5," gets\n");
    }
    p_Var8 = &(pSVar4->_M_h)._M_before_begin;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      get._M_nxt = p_Var8[1]._M_nxt;
      pGVar6 = LocalGraph::getGetInfluences(localGraph,(LocalGet *)get._M_nxt);
      uVar1 = (pGVar6->_M_h)._M_element_count;
      if (1 < uVar1) {
        __assert_fail("sets.size() <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                      ,0x67,
                      "void wasm::DataFlow::UseFinder::addSetUses(LocalSet *, Graph &, LocalGraph &, std::vector<Expression *> &)"
                     );
      }
      if (uVar1 == 0) {
        pEVar7 = Graph::getParent(graph,(Expression *)get._M_nxt);
        if ((pEVar7 == (Expression *)0x0) || (pEVar7->_id != DropId)) {
          set_local = (LocalSet *)0x0;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)ret,
                     (Expression **)&set_local);
          iVar3 = debug();
          if (1 < iVar3) {
            std::operator<<((ostream *)&std::cout,"add nullptr\n");
          }
        }
      }
      else {
        set_00 = (LocalSet *)(pGVar6->_M_h)._M_before_begin._M_nxt[1]._M_nxt;
        pLVar2 = (LocalSet *)set_00->value;
        if (pLVar2 == (LocalSet *)get._M_nxt) {
          addSetUses(this,set_00,graph,localGraph,ret);
        }
        else {
          set_local = pLVar2;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    (ret,(value_type *)&set_local);
          iVar3 = debug();
          if (1 < iVar3) {
            poVar5 = std::operator<<((ostream *)&std::cout,"add a value\n");
            poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
            std::operator<<(poVar5,'\n');
          }
        }
      }
    }
  }
  return;
}

Assistant:

void addSetUses(LocalSet* set,
                  Graph& graph,
                  LocalGraph& localGraph,
                  std::vector<Expression*>& ret) {
    // If already handled, nothing to do here.
    if (!seenSets.emplace(set).second) {
      return;
    }
    // Find all the uses of that set.
    auto& gets = localGraph.getSetInfluences(set);
    if (debug() >= 2) {
      std::cout << "addSetUses for " << set << ", " << gets.size() << " gets\n";
    }
    for (auto* get : gets) {
      // Each of these relevant gets is either
      //  (1) a child of a set, which we can track, or
      //  (2) not a child of a set, e.g., a call argument or such
      auto& sets = localGraph.getGetInfluences(get); // TODO: iterator
      // In flat IR, each get can influence at most 1 set.
      assert(sets.size() <= 1);
      if (sets.size() == 0) {
        // This get is not the child of a set. Check if it is a drop,
        // otherwise it is an actual use, and so an external use.
        auto* parent = graph.getParent(get);
        if (parent && parent->is<Drop>()) {
          // Just ignore it.
        } else {
          ret.push_back(nullptr);
          if (debug() >= 2) {
            std::cout << "add nullptr\n";
          }
        }
      } else {
        // This get is the child of a set.
        auto* subSet = *sets.begin();
        // If this is a copy, we need to look through it: data-flow IR
        // counts actual values, not copies, and in particular we need
        // to look through the copies that implement a phi.
        if (subSet->value == get) {
          // Indeed a copy.
          // TODO: this could be optimized and done all at once beforehand.
          addSetUses(subSet, graph, localGraph, ret);
        } else {
          // Not a copy.
          auto* value = subSet->value;
          ret.push_back(value);
          if (debug() >= 2) {
            std::cout << "add a value\n" << value << '\n';
          }
        }
      }
    }
  }